

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O2

void __thiscall
btJacobianEntry::btJacobianEntry
          (btJacobianEntry *this,btVector3 *jointAxis,btMatrix3x3 *world2A,btMatrix3x3 *world2B,
          btVector3 *inertiaInvA,btVector3 *inertiaInvB)

{
  btScalar bVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 local_40;
  
  (this->m_linearJointAxis).m_floats[0] = 0.0;
  (this->m_linearJointAxis).m_floats[1] = 0.0;
  (this->m_linearJointAxis).m_floats[2] = 0.0;
  (this->m_linearJointAxis).m_floats[3] = 0.0;
  bVar3 = operator*(world2A,jointAxis);
  *&(this->m_aJ).m_floats = bVar3.m_floats;
  local_40 = operator-(jointAxis);
  bVar3 = operator*(world2B,&local_40);
  *&(this->m_bJ).m_floats = bVar3.m_floats;
  bVar3 = operator*(inertiaInvA,&this->m_aJ);
  *&(this->m_0MinvJt).m_floats = bVar3.m_floats;
  bVar3 = operator*(inertiaInvB,&this->m_bJ);
  *&(this->m_1MinvJt).m_floats = bVar3.m_floats;
  bVar1 = btVector3::dot(&this->m_0MinvJt,&this->m_aJ);
  bVar2 = btVector3::dot(&this->m_1MinvJt,&this->m_bJ);
  this->m_Adiag = bVar2 + bVar1;
  return;
}

Assistant:

btJacobianEntry(const btVector3& jointAxis,
		const btMatrix3x3& world2A,
		const btMatrix3x3& world2B,
		const btVector3& inertiaInvA,
		const btVector3& inertiaInvB)
		:m_linearJointAxis(btVector3(btScalar(0.),btScalar(0.),btScalar(0.)))
	{
		m_aJ= world2A*jointAxis;
		m_bJ = world2B*-jointAxis;
		m_0MinvJt	= inertiaInvA * m_aJ;
		m_1MinvJt = inertiaInvB * m_bJ;
		m_Adiag =  m_0MinvJt.dot(m_aJ) + m_1MinvJt.dot(m_bJ);

		btAssert(m_Adiag > btScalar(0.0));
	}